

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O3

bool __thiscall MyServer::Initialize(MyServer *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  bool bVar1;
  SDKJsonResult result;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  SDKJsonResult local_1c8;
  undefined1 local_1a0 [392];
  
  (this->super_SDKSocket).Config.UDPListenPort = 0x13c4;
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.MinuteFloodThresh = 2;
  (this->super_SDKSocket).Config.BandwidthLimitBPS = 4000000;
  (this->super_SDKSocket).Config.Flags = 6;
  tonk::SDKSocket::Create(&local_1c8,&this->super_SDKSocket);
  if (local_1c8.super_SDKResult.Result == Tonk_Success) {
    bVar1 = true;
  }
  else {
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_1c8.ErrorJson._M_dataplus._M_p,
               local_1c8.ErrorJson._M_dataplus._M_p + local_1c8.ErrorJson._M_string_length);
    if ((int)Logger.ChannelMinLevel < 5) {
      this_00 = (ostringstream *)(local_1a0 + 0x10);
      local_1a0._0_8_ = Logger.ChannelName;
      local_1a0._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Unable to create socket: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_1e8,local_1e0);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    bVar1 = local_1c8.super_SDKResult.Result == Tonk_Success;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.ErrorJson._M_dataplus._M_p != &local_1c8.ErrorJson.field_2) {
    operator_delete(local_1c8.ErrorJson._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool MyServer::Initialize()
{
    // Set configuration
    Config.UDPListenPort = kUDPServerPort_Server;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.MinuteFloodThresh = 2;
    Config.BandwidthLimitBPS = 4000000;
    //Config.InterfaceAddress = "127.0.0.1";

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
    }

    return result;
}